

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_sse2.c
# Opt level: O1

void aom_int_pro_row_sse2
               (int16_t *hbuf,uint8_t *ref,int ref_stride,int width,int height,int norm_factor)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  unkuint9 Var18;
  undefined1 auVar19 [11];
  undefined1 auVar20 [15];
  unkuint9 Var21;
  undefined1 auVar22 [11];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  ulong uVar27;
  undefined1 (*pauVar28) [16];
  int iVar29;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  undefined1 auVar30 [16];
  short sVar37;
  short sVar39;
  short sVar40;
  short sVar41;
  short sVar42;
  short sVar43;
  short sVar44;
  undefined1 auVar38 [16];
  short sVar45;
  
  if (0 < width) {
    uVar27 = 0;
    do {
      pauVar28 = (undefined1 (*) [16])(ref + uVar27);
      auVar30 = (undefined1  [16])0x0;
      iVar29 = 0;
      auVar38 = (undefined1  [16])0x0;
      do {
        auVar1 = *pauVar28;
        auVar3[0xd] = 0;
        auVar3._0_13_ = auVar1._0_13_;
        auVar3[0xe] = auVar1[7];
        auVar5[0xc] = auVar1[6];
        auVar5._0_12_ = auVar1._0_12_;
        auVar5._13_2_ = auVar3._13_2_;
        auVar7[0xb] = 0;
        auVar7._0_11_ = auVar1._0_11_;
        auVar7._12_3_ = auVar5._12_3_;
        auVar9[10] = auVar1[5];
        auVar9._0_10_ = auVar1._0_10_;
        auVar9._11_4_ = auVar7._11_4_;
        auVar11[9] = 0;
        auVar11._0_9_ = auVar1._0_9_;
        auVar11._10_5_ = auVar9._10_5_;
        auVar13[8] = auVar1[4];
        auVar13._0_8_ = auVar1._0_8_;
        auVar13._9_6_ = auVar11._9_6_;
        auVar17._7_8_ = 0;
        auVar17._0_7_ = auVar13._8_7_;
        Var18 = CONCAT81(SUB158(auVar17 << 0x40,7),auVar1[3]);
        auVar23._9_6_ = 0;
        auVar23._0_9_ = Var18;
        auVar19._1_10_ = SUB1510(auVar23 << 0x30,5);
        auVar19[0] = auVar1[2];
        auVar24._11_4_ = 0;
        auVar24._0_11_ = auVar19;
        auVar15[2] = auVar1[1];
        auVar15._0_2_ = auVar1._0_2_;
        auVar15._3_12_ = SUB1512(auVar24 << 0x20,3);
        sVar39 = auVar38._2_2_;
        sVar40 = auVar38._4_2_;
        sVar41 = auVar38._6_2_;
        sVar42 = auVar38._8_2_;
        sVar43 = auVar38._10_2_;
        sVar44 = auVar38._12_2_;
        sVar45 = auVar38._14_2_;
        sVar31 = auVar30._2_2_;
        sVar32 = auVar30._4_2_;
        sVar33 = auVar30._6_2_;
        sVar34 = auVar30._8_2_;
        sVar35 = auVar30._10_2_;
        sVar36 = auVar30._12_2_;
        sVar37 = auVar30._14_2_;
        auVar2 = *(undefined1 (*) [16])(*pauVar28 + ref_stride);
        pauVar28 = (undefined1 (*) [16])(*pauVar28 + (long)ref_stride * 2);
        auVar4[0xd] = 0;
        auVar4._0_13_ = auVar2._0_13_;
        auVar4[0xe] = auVar2[7];
        auVar6[0xc] = auVar2[6];
        auVar6._0_12_ = auVar2._0_12_;
        auVar6._13_2_ = auVar4._13_2_;
        auVar8[0xb] = 0;
        auVar8._0_11_ = auVar2._0_11_;
        auVar8._12_3_ = auVar6._12_3_;
        auVar10[10] = auVar2[5];
        auVar10._0_10_ = auVar2._0_10_;
        auVar10._11_4_ = auVar8._11_4_;
        auVar12[9] = 0;
        auVar12._0_9_ = auVar2._0_9_;
        auVar12._10_5_ = auVar10._10_5_;
        auVar14[8] = auVar2[4];
        auVar14._0_8_ = auVar2._0_8_;
        auVar14._9_6_ = auVar12._9_6_;
        auVar20._7_8_ = 0;
        auVar20._0_7_ = auVar14._8_7_;
        Var21 = CONCAT81(SUB158(auVar20 << 0x40,7),auVar2[3]);
        auVar25._9_6_ = 0;
        auVar25._0_9_ = Var21;
        auVar22._1_10_ = SUB1510(auVar25 << 0x30,5);
        auVar22[0] = auVar2[2];
        auVar26._11_4_ = 0;
        auVar26._0_11_ = auVar22;
        auVar16[2] = auVar2[1];
        auVar16._0_2_ = auVar2._0_2_;
        auVar16._3_12_ = SUB1512(auVar26 << 0x20,3);
        auVar38._0_2_ = (auVar2._0_2_ & 0xff) + (auVar1._0_2_ & 0xff) + auVar38._0_2_;
        auVar38._2_2_ = auVar16._2_2_ + auVar15._2_2_ + sVar39;
        auVar38._4_2_ = auVar22._0_2_ + auVar19._0_2_ + sVar40;
        auVar38._6_2_ = (short)Var21 + (short)Var18 + sVar41;
        auVar38._8_2_ = auVar14._8_2_ + auVar13._8_2_ + sVar42;
        auVar38._10_2_ = auVar10._10_2_ + auVar9._10_2_ + sVar43;
        auVar38._12_2_ = auVar6._12_2_ + auVar5._12_2_ + sVar44;
        auVar38._14_2_ = (auVar4._13_2_ >> 8) + (auVar3._13_2_ >> 8) + sVar45;
        auVar30._0_2_ = (ushort)auVar2[8] + (ushort)auVar1[8] + auVar30._0_2_;
        auVar30._2_2_ = (ushort)auVar2[9] + (ushort)auVar1[9] + sVar31;
        auVar30._4_2_ = (ushort)auVar2[10] + (ushort)auVar1[10] + sVar32;
        auVar30._6_2_ = (ushort)auVar2[0xb] + (ushort)auVar1[0xb] + sVar33;
        auVar30._8_2_ = (ushort)auVar2[0xc] + (ushort)auVar1[0xc] + sVar34;
        auVar30._10_2_ = (ushort)auVar2[0xd] + (ushort)auVar1[0xd] + sVar35;
        auVar30._12_2_ = (ushort)auVar2[0xe] + (ushort)auVar1[0xe] + sVar36;
        auVar30._14_2_ = (ushort)auVar2[0xf] + (ushort)auVar1[0xf] + sVar37;
        iVar29 = iVar29 + 2;
      } while (iVar29 < height);
      auVar38 = psraw(auVar38,ZEXT416((uint)norm_factor));
      auVar30 = psraw(auVar30,ZEXT416((uint)norm_factor));
      *(undefined1 (*) [16])(hbuf + uVar27) = auVar38;
      *(undefined1 (*) [16])(hbuf + uVar27 + 8) = auVar30;
      uVar27 = uVar27 + 0x10;
    } while (uVar27 < (uint)width);
  }
  return;
}

Assistant:

void aom_int_pro_row_sse2(int16_t *hbuf, const uint8_t *ref,
                          const int ref_stride, const int width,
                          const int height, int norm_factor) {
  // SIMD implementation assumes width and height to be multiple of 16 and 2
  // respectively. For any odd width or height, SIMD support needs to be added.
  assert(width % 16 == 0 && height % 2 == 0);
  __m128i zero = _mm_setzero_si128();

  for (int wd = 0; wd < width; wd += 16) {
    const uint8_t *ref_tmp = ref + wd;
    int16_t *hbuf_tmp = hbuf + wd;
    __m128i s0 = zero;
    __m128i s1 = zero;
    int idx = 0;
    do {
      __m128i src_line = _mm_loadu_si128((const __m128i *)ref_tmp);
      __m128i t0 = _mm_unpacklo_epi8(src_line, zero);
      __m128i t1 = _mm_unpackhi_epi8(src_line, zero);
      s0 = _mm_add_epi16(s0, t0);
      s1 = _mm_add_epi16(s1, t1);
      ref_tmp += ref_stride;

      src_line = _mm_loadu_si128((const __m128i *)ref_tmp);
      t0 = _mm_unpacklo_epi8(src_line, zero);
      t1 = _mm_unpackhi_epi8(src_line, zero);
      s0 = _mm_add_epi16(s0, t0);
      s1 = _mm_add_epi16(s1, t1);
      ref_tmp += ref_stride;
      idx += 2;
    } while (idx < height);

    s0 = _mm_srai_epi16(s0, norm_factor);
    s1 = _mm_srai_epi16(s1, norm_factor);
    _mm_storeu_si128((__m128i *)(hbuf_tmp), s0);
    _mm_storeu_si128((__m128i *)(hbuf_tmp + 8), s1);
  }
}